

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall kratos::IRVisitor::visit_generator_root_p(IRVisitor *this,Generator *generator)

{
  pointer *this_00;
  pointer *this_01;
  bool bVar1;
  size_type sVar2;
  reference __x;
  reference ppGVar3;
  reference this_02;
  future<void> *t_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> *__range2_1;
  undefined1 local_1c0 [8];
  future<void> t;
  Generator *mod;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> tasks;
  value_type current_level;
  undefined1 local_158 [4];
  int i;
  thread_pool pool;
  uint32_t num_cpus;
  undefined1 local_70 [8];
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  levels;
  GeneratorGraph graph;
  Generator *generator_local;
  IRVisitor *this_local;
  
  this_00 = &levels.
             super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  GeneratorGraph::GeneratorGraph((GeneratorGraph *)this_00,generator);
  GeneratorGraph::get_leveled_nodes
            ((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
              *)local_70,(GeneratorGraph *)this_00);
  pool.thread_mutex_.super___mutex_base._M_mutex._32_4_ = get_num_cpus();
  cxxpool::thread_pool::thread_pool
            ((thread_pool *)local_158,
             (ulong)(uint)pool.thread_mutex_.super___mutex_base._M_mutex._32_4_);
  sVar2 = std::
          vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
          ::size((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                  *)local_70);
  current_level.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint32_t)sVar2;
  while (current_level.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
              current_level.
              super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ - 1,
        -1 < (int)current_level.
                  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
    this->level = current_level.
                  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    cxxpool::thread_pool::clear((thread_pool *)local_158);
    __x = std::
          vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
          ::operator[]((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
                        *)local_70,
                       (long)(int)current_level.
                                  super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::vector
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
               &tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,__x);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&__range2);
    sVar2 = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::size
                      ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
                       &tasks.
                        super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::reserve
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&__range2,sVar2);
    this_01 = &tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2 = std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::begin
                       ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)this_01
                       );
    mod = (Generator *)
          std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::end
                    ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
                                  *)&mod);
      if (!bVar1) break;
      ppGVar3 = __gnu_cxx::
                __normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
                ::operator*(&__end2);
      t.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppGVar3;
      __range2_1 = (vector<std::future<void>,_std::allocator<std::future<void>_>_> *)this;
      cxxpool::thread_pool::
      push<kratos::IRVisitor::visit_generator_root_p(kratos::Generator*)::__0,kratos::Generator*&>
                ((thread_pool *)local_1c0,(anon_class_8_1_8991fb9c_for__M_f *)local_158,
                 (Generator **)&__range2_1);
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&__range2,
                 (future<void> *)local_1c0);
      std::future<void>::~future((future<void> *)local_1c0);
      __gnu_cxx::
      __normal_iterator<kratos::Generator_**,_std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::begin
                         ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                          &__range2);
    t_1 = (future<void> *)
          std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::end
                    ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                          *)&t_1);
      if (!bVar1) break;
      this_02 = __gnu_cxx::
                __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                ::operator*(&__end2_1);
      std::future<void>::get(this_02);
      __gnu_cxx::
      __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
      ::operator++(&__end2_1);
    }
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&__range2);
    std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::~vector
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
               &tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  cxxpool::thread_pool::~thread_pool((thread_pool *)local_158);
  std::
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  ::~vector((vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
             *)local_70);
  GeneratorGraph::~GeneratorGraph
            ((GeneratorGraph *)
             &levels.
              super__Vector_base<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void IRVisitor::visit_generator_root_p(kratos::Generator *generator) {
    GeneratorGraph graph(generator);
    auto levels = graph.get_leveled_nodes();
    uint32_t num_cpus = get_num_cpus();
    cxxpool::thread_pool pool{num_cpus};
    for (int i = static_cast<int>(levels.size() - 1); i >= 0; i--) {
        level = static_cast<uint32_t>(i);
        pool.clear();
        auto current_level = levels[i];
        std::vector<std::future<void>> tasks;
        tasks.reserve(current_level.size());
        for (auto *mod : current_level) {
            auto t = pool.push([=](Generator *g) { g->accept_generator(this); }, mod);
            tasks.emplace_back(std::move(t));
        }
        for (auto &t : tasks) {
            t.get();
        }
    }
}